

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O0

cupdlp_int cupdlp_scaleVector(CUPDLPwork *w,cupdlp_float weight,cupdlp_float *x,cupdlp_int n)

{
  cupdlp_int in_EDX;
  cupdlp_float *in_RSI;
  cupdlp_float in_XMM0_Qa;
  
  ScaleVector(in_XMM0_Qa,in_RSI,in_EDX);
  return 0;
}

Assistant:

cupdlp_int cupdlp_scaleVector(CUPDLPwork *w, const cupdlp_float weight,
                              cupdlp_float *x, const cupdlp_int n) {
#ifndef CUPDLP_CPU
#ifndef SFLOAT
  CHECK_CUBLAS(cublasDscal(w->cublashandle, n, &weight, x, 1));
#else
  CHECK_CUBLAS(cublasSscal(w->cublashandle, n, &weight, x, 1));
#endif
#else
  ScaleVector(weight, x, n);
#endif
  return 0;
}